

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub.c
# Opt level: O2

int sub0_ctx_unsubscribe(sub0_ctx *ctx,void *buf,size_t sz)

{
  nni_list *list;
  nni_lmq *lmq;
  _Bool _Var1;
  int iVar2;
  void *item;
  size_t sVar3;
  uint8_t *body;
  size_t len;
  nni_mtx *mtx;
  bool bVar4;
  nni_msg *local_38;
  nni_msg *msg;
  
  mtx = &ctx->sock->lk;
  nni_mtx_lock(mtx);
  list = &ctx->topics;
  item = nni_list_first(list);
  while( true ) {
    if (item == (void *)0x0) {
      nni_mtx_unlock(mtx);
      return 0xc;
    }
    if ((*(size_t *)((long)item + 0x10) == sz) &&
       (iVar2 = bcmp(*(void **)((long)item + 0x18),buf,sz), iVar2 == 0)) break;
    item = nni_list_next(list,item);
  }
  nni_list_remove(list,item);
  lmq = &ctx->lmq;
  sVar3 = nni_lmq_len(lmq);
  while (bVar4 = sVar3 != 0, sVar3 = sVar3 - 1, bVar4) {
    nni_lmq_get(lmq,&local_38);
    body = (uint8_t *)nni_msg_body(local_38);
    len = nni_msg_len(local_38);
    _Var1 = sub0_matches(ctx,body,len);
    if (_Var1) {
      nni_lmq_put(lmq,local_38);
    }
    else {
      nni_msg_free(local_38);
    }
  }
  nni_mtx_unlock(mtx);
  nni_free(*(void **)((long)item + 0x18),*(size_t *)((long)item + 0x10));
  nni_free(item,0x20);
  return 0;
}

Assistant:

static int
sub0_ctx_unsubscribe(sub0_ctx *ctx, const void *buf, size_t sz)
{
	sub0_sock  *sock = ctx->sock;
	sub0_topic *topic;
	size_t      len;

	nni_mtx_lock(&sock->lk);
	NNI_LIST_FOREACH (&ctx->topics, topic) {
		if (topic->len != sz) {
			continue;
		}
		if (memcmp(topic->buf, buf, sz) == 0) {
			// Matched!
			break;
		}
	}
	if (topic == NULL) {
		nni_mtx_unlock(&sock->lk);
		return (NNG_ENOENT);
	}
	nni_list_remove(&ctx->topics, topic);

	// Now we need to make sure that any messages that are waiting still
	// match the subscription.  We basically just run through the queue
	// and requeue those messages we need.
	len = nni_lmq_len(&ctx->lmq);
	for (size_t i = 0; i < len; i++) {
		nni_msg *msg;

		(void) nni_lmq_get(&ctx->lmq, &msg);
		if (sub0_matches(ctx, nni_msg_body(msg), nni_msg_len(msg))) {
			(void) nni_lmq_put(&ctx->lmq, msg);
		} else {
			nni_msg_free(msg);
		}
	}
	nni_mtx_unlock(&sock->lk);

	nni_free(topic->buf, topic->len);
	NNI_FREE_STRUCT(topic);
	return (0);
}